

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TemplatedCustomNamer.cpp
# Opt level: O2

Path * __thiscall
ApprovalTests::TemplatedCustomNamer::constructFromTemplate
          (Path *__return_storage_ptr__,TemplatedCustomNamer *this,string *extensionWithDot,
          string *approvedOrReceivedReplacement)

{
  string result;
  allocator local_309;
  string local_308;
  string local_2e8;
  string local_2c8;
  string local_2a8;
  string local_288;
  string local_268;
  string local_248;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  string local_1a8;
  string local_188;
  string local_168;
  string local_148;
  string local_128;
  _Any_data local_108;
  code *local_f8;
  code *local_f0;
  _Any_data local_e8;
  code *local_d8;
  code *local_d0;
  _Any_data local_c8;
  code *local_b8;
  code *local_b0;
  _Any_data local_a8;
  code *local_98;
  code *local_90;
  _Any_data local_88;
  code *local_78;
  code *local_70;
  _Any_data local_68;
  code *local_58;
  code *local_50;
  _Any_data local_48;
  code *local_38;
  code *local_30;
  
  ::std::__cxx11::string::string((string *)&local_2e8,(string *)&this->template_);
  ::std::__cxx11::string::string((string *)&local_128,(string *)&local_2e8);
  ::std::__cxx11::string::string((string *)&local_148,"{FileExtension}",&local_309);
  local_48._8_8_ = 0;
  local_30 = ::std::
             _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/ApprovalTests/namers/TemplatedCustomNamer.cpp:55:59)>
             ::_M_invoke;
  local_38 = ::std::
             _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/ApprovalTests/namers/TemplatedCustomNamer.cpp:55:59)>
             ::_M_manager;
  local_48._M_unused._M_object = extensionWithDot;
  anon_unknown.dwarf_305cb2::replaceIfContains
            (&local_308,&local_128,&local_148,
             (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
              *)&local_48);
  ::std::__cxx11::string::operator=((string *)&local_2e8,(string *)&local_308);
  ::std::__cxx11::string::~string((string *)&local_308);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_48);
  ::std::__cxx11::string::~string((string *)&local_148);
  ::std::__cxx11::string::~string((string *)&local_128);
  ::std::__cxx11::string::string((string *)&local_168,(string *)&local_2e8);
  ::std::__cxx11::string::string((string *)&local_188,"{ApprovalsSubdirectory}",&local_309);
  local_68._8_8_ = 0;
  local_50 = ::std::
             _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/ApprovalTests/namers/TemplatedCustomNamer.cpp:56:67)>
             ::_M_invoke;
  local_58 = ::std::
             _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/ApprovalTests/namers/TemplatedCustomNamer.cpp:56:67)>
             ::_M_manager;
  local_68._M_unused._M_object = this;
  anon_unknown.dwarf_305cb2::replaceIfContains
            (&local_308,&local_168,&local_188,
             (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
              *)&local_68);
  ::std::__cxx11::string::operator=((string *)&local_2e8,(string *)&local_308);
  ::std::__cxx11::string::~string((string *)&local_308);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_68);
  ::std::__cxx11::string::~string((string *)&local_188);
  ::std::__cxx11::string::~string((string *)&local_168);
  ::std::__cxx11::string::string((string *)&local_1a8,(string *)&local_2e8);
  ::std::__cxx11::string::string((string *)&local_1c8,"{RelativeTestSourceDirectory}",&local_309);
  local_88._8_8_ = 0;
  local_70 = ::std::
             _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/ApprovalTests/namers/TemplatedCustomNamer.cpp:57:73)>
             ::_M_invoke;
  local_78 = ::std::
             _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/ApprovalTests/namers/TemplatedCustomNamer.cpp:57:73)>
             ::_M_manager;
  local_88._M_unused._M_object = this;
  anon_unknown.dwarf_305cb2::replaceIfContains
            (&local_308,&local_1a8,&local_1c8,
             (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
              *)&local_88);
  ::std::__cxx11::string::operator=((string *)&local_2e8,(string *)&local_308);
  ::std::__cxx11::string::~string((string *)&local_308);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_88);
  ::std::__cxx11::string::~string((string *)&local_1c8);
  ::std::__cxx11::string::~string((string *)&local_1a8);
  ::std::__cxx11::string::string((string *)&local_1e8,(string *)&local_2e8);
  ::std::__cxx11::string::string((string *)&local_208,"{TestFileName}",&local_309);
  local_a8._8_8_ = 0;
  local_90 = ::std::
             _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/ApprovalTests/namers/TemplatedCustomNamer.cpp:58:58)>
             ::_M_invoke;
  local_98 = ::std::
             _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/ApprovalTests/namers/TemplatedCustomNamer.cpp:58:58)>
             ::_M_manager;
  local_a8._M_unused._M_object = this;
  anon_unknown.dwarf_305cb2::replaceIfContains
            (&local_308,&local_1e8,&local_208,
             (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
              *)&local_a8);
  ::std::__cxx11::string::operator=((string *)&local_2e8,(string *)&local_308);
  ::std::__cxx11::string::~string((string *)&local_308);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_a8);
  ::std::__cxx11::string::~string((string *)&local_208);
  ::std::__cxx11::string::~string((string *)&local_1e8);
  ::std::__cxx11::string::string((string *)&local_228,(string *)&local_2e8);
  ::std::__cxx11::string::string((string *)&local_248,"{TestCaseName}",&local_309);
  local_c8._8_8_ = 0;
  local_b0 = ::std::
             _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/ApprovalTests/namers/TemplatedCustomNamer.cpp:59:58)>
             ::_M_invoke;
  local_b8 = ::std::
             _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/ApprovalTests/namers/TemplatedCustomNamer.cpp:59:58)>
             ::_M_manager;
  local_c8._M_unused._M_object = this;
  anon_unknown.dwarf_305cb2::replaceIfContains
            (&local_308,&local_228,&local_248,
             (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
              *)&local_c8);
  ::std::__cxx11::string::operator=((string *)&local_2e8,(string *)&local_308);
  ::std::__cxx11::string::~string((string *)&local_308);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_c8);
  ::std::__cxx11::string::~string((string *)&local_248);
  ::std::__cxx11::string::~string((string *)&local_228);
  ::std::__cxx11::string::string((string *)&local_268,(string *)&local_2e8);
  ::std::__cxx11::string::string((string *)&local_288,"{TestSourceDirectory}",&local_309);
  local_e8._8_8_ = 0;
  local_d0 = ::std::
             _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/ApprovalTests/namers/TemplatedCustomNamer.cpp:60:65)>
             ::_M_invoke;
  local_d8 = ::std::
             _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/ApprovalTests/namers/TemplatedCustomNamer.cpp:60:65)>
             ::_M_manager;
  local_e8._M_unused._M_object = this;
  anon_unknown.dwarf_305cb2::replaceIfContains
            (&local_308,&local_268,&local_288,
             (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
              *)&local_e8);
  ::std::__cxx11::string::operator=((string *)&local_2e8,(string *)&local_308);
  ::std::__cxx11::string::~string((string *)&local_308);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_e8);
  ::std::__cxx11::string::~string((string *)&local_288);
  ::std::__cxx11::string::~string((string *)&local_268);
  ::std::__cxx11::string::string((string *)&local_2a8,(string *)&local_2e8);
  ::std::__cxx11::string::string((string *)&local_2c8,"{ApprovedOrReceived}",&local_309);
  local_108._8_8_ = 0;
  local_f0 = ::std::
             _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/ApprovalTests/namers/TemplatedCustomNamer.cpp:61:64)>
             ::_M_invoke;
  local_f8 = ::std::
             _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/ApprovalTests/namers/TemplatedCustomNamer.cpp:61:64)>
             ::_M_manager;
  local_108._M_unused._M_object = approvedOrReceivedReplacement;
  anon_unknown.dwarf_305cb2::replaceIfContains
            (&local_308,&local_2a8,&local_2c8,
             (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
              *)&local_108);
  ::std::__cxx11::string::operator=((string *)&local_2e8,(string *)&local_308);
  ::std::__cxx11::string::~string((string *)&local_308);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_108);
  ::std::__cxx11::string::~string((string *)&local_2c8);
  ::std::__cxx11::string::~string((string *)&local_2a8);
  Path::Path(__return_storage_ptr__,&local_2e8);
  ::std::__cxx11::string::~string((string *)&local_2e8);
  return __return_storage_ptr__;
}

Assistant:

Path TemplatedCustomNamer::constructFromTemplate(
        const std::string& extensionWithDot,
        const std::string& approvedOrReceivedReplacement) const
    {
        std::string result = template_;
        // begin-snippet: custom_namer_tags
        auto testSourceDirectory = "{TestSourceDirectory}";
        auto relativeTestSourceDirectory = "{RelativeTestSourceDirectory}";
        auto approvalsSubdirectory = "{ApprovalsSubdirectory}";
        auto testFileName = "{TestFileName}";
        auto testCaseName = "{TestCaseName}";
        auto approvedOrReceived = "{ApprovedOrReceived}";
        auto fileExtension = "{FileExtension}";
        // end-snippet

        using namespace ApprovalTests;

        // clang-format off
        result = replaceIfContains(result, fileExtension, [&](){return extensionWithDot.substr(1);});
        result = replaceIfContains(result, approvalsSubdirectory, [&](){return namer_.getApprovalsSubdirectory();});
        result = replaceIfContains(result, relativeTestSourceDirectory, [&](){return namer_.getRelativeTestSourceDirectory();});
        result = replaceIfContains(result, testFileName, [&](){return namer_.getSourceFileName();});
        result = replaceIfContains(result, testCaseName, [&](){return namer_.getTestName();});
        result = replaceIfContains(result, testSourceDirectory, [&](){return namer_.getTestSourceDirectory();});
        result = replaceIfContains(result, approvedOrReceived, [&](){return approvedOrReceivedReplacement;});
        // clang-format on

        // Convert to native directory separators:
        return Path(result);
    }